

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bws.c
# Opt level: O2

void nn_bws_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint uVar1;
  nn_fsm_fn p_Var2;
  nn_list_item *it;
  char *pcVar3;
  undefined8 uVar4;
  ulong uVar5;
  
  uVar5 = (ulong)(uint)src;
  if (*(int *)&self[1].fn == 2) {
    if (src == 1) {
      if (0xfffffffd < type - 9U) {
        return;
      }
      nn_backtrace_print();
      pcVar3 = "type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED";
      uVar4 = 0x10a;
    }
    else {
      if (src == 2) {
        if (type == 0x85b9) {
          nn_list_erase((nn_list *)&self[8].state,(nn_list_item *)((long)srcptr + 0x1b70));
          nn_aws_term((nn_aws *)srcptr);
          nn_free(srcptr);
          return;
        }
        if (type == 0x85b8) {
          nn_aws_stop((nn_aws *)srcptr);
          return;
        }
        if (type == 0x85b7) {
          p_Var2 = self[8].shutdown_fn;
          it = nn_list_end((nn_list *)&self[8].state);
          nn_list_insert((nn_list *)&self[8].state,(nn_list_item *)(p_Var2 + 0x1b70),it);
          self[8].shutdown_fn = (nn_fsm_fn)0x0;
          nn_bws_start_accepting((nn_bws *)self);
          return;
        }
        nn_backtrace_print();
        uVar1 = *(uint *)&self[1].fn;
        pcVar3 = "Unexpected action";
        uVar5 = 2;
        uVar4 = 0x128;
        goto LAB_001b457e;
      }
      nn_backtrace_print();
      pcVar3 = "src == NN_BWS_SRC_AWS";
      uVar4 = 0x110;
    }
  }
  else {
    if (*(int *)&self[1].fn != 1) {
      nn_backtrace_print();
      uVar1 = *(uint *)&self[1].fn;
      pcVar3 = "Unexpected state";
      uVar4 = 0x12f;
LAB_001b457e:
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar3,(ulong)uVar1,uVar5,
              (ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
              ,uVar4);
      goto LAB_001b453f;
    }
    if (src == -2) {
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
      nn_backtrace_print();
      pcVar3 = "type == NN_FSM_START";
      uVar4 = 0x100;
    }
    else {
      nn_backtrace_print();
      pcVar3 = "src == NN_FSM_ACTION";
      uVar4 = 0xff;
    }
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar3,
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/bws.c"
          ,uVar4);
LAB_001b453f:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_bws_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_bws *bws;
    struct nn_aws *aws;

    bws = nn_cont (self, struct nn_bws, fsm);

    switch (bws->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BWS_STATE_IDLE:
        nn_assert (src == NN_FSM_ACTION);
        nn_assert (type == NN_FSM_START);
        bws->state = NN_BWS_STATE_ACTIVE;
        return;

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the aws state machine in this state.          */
/******************************************************************************/
    case NN_BWS_STATE_ACTIVE:
        if (src == NN_BWS_SRC_USOCK) {
            nn_assert (type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED);
            return;
        }

        /*  For all remaining events we'll assume they are coming from one
            of remaining child aws objects. */
        nn_assert (src == NN_BWS_SRC_AWS);
        aws = (struct nn_aws*) srcptr;
        switch (type) {
        case NN_AWS_ACCEPTED:

            /*  Move the newly created connection to the list of existing
                connections. */
            nn_list_insert (&bws->awss, &bws->aws->item,
                nn_list_end (&bws->awss));
            bws->aws = NULL;

            /*  Start waiting for a new incoming connection. */
            nn_bws_start_accepting (bws);
            return;

        case NN_AWS_ERROR:
            nn_aws_stop (aws);
            return;
        case NN_AWS_STOPPED:
            nn_list_erase (&bws->awss, &aws->item);
            nn_aws_term (aws);
            nn_free (aws);
            return;
        default:
            nn_fsm_bad_action (bws->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (bws->state, src, type);
    }
}